

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlphaVectorPlanning.cpp
# Opt level: O1

void AlphaVectorPlanning::ExportPOMDPFile(string *filename,DecPOMDPDiscreteInterface *decpomdp)

{
  long lVar1;
  int iVar2;
  int iVar3;
  ostream *poVar4;
  long *plVar5;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var6;
  long *plVar7;
  int iVar8;
  int s1;
  int iVar9;
  double dVar10;
  string state;
  ofstream fp;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_288;
  long local_278;
  long lStack_270;
  undefined8 local_268;
  double local_260;
  undefined1 local_258;
  undefined7 uStack_257;
  long local_248 [2];
  undefined8 local_238;
  long local_230;
  filebuf local_228 [24];
  byte abStack_210 [216];
  ios_base local_138 [264];
  
  local_268 = (**(code **)(*(long *)(&decpomdp->field_0x0 + *(long *)(*(long *)decpomdp + -0xb8)) +
                          0x68))(&decpomdp->field_0x0 + *(long *)(*(long *)decpomdp + -0xb8));
  local_238 = (**(code **)(*(long *)(&decpomdp->field_0x0 + *(long *)(*(long *)decpomdp + -0xb8)) +
                          200))(&decpomdp->field_0x0 + *(long *)(*(long *)decpomdp + -0xb8));
  iVar2 = (**(code **)(*(long *)(&decpomdp->field_0x0 + *(long *)(*(long *)decpomdp + -0xb8)) + 0x30
                      ))(&decpomdp->field_0x0 + *(long *)(*(long *)decpomdp + -0xb8));
  std::ofstream::ofstream(&local_230,(filename->_M_dataplus)._M_p,_S_out);
  if ((abStack_210[*(long *)(local_230 + -0x18)] & 5) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"AlphaVectorPOMDP::ExportPOMDPFile: failed to open file ",0x37)
    ;
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(filename->_M_dataplus)._M_p,
                        filename->_M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"discount: ",10);
  dVar10 = (double)(**(code **)(*(long *)(&decpomdp->field_0x0 +
                                         *(long *)(*(long *)decpomdp + -0xb0)) + 0x70))
                             (&decpomdp->field_0x0 + *(long *)(*(long *)decpomdp + -0xb0));
  poVar4 = std::ostream::_M_insert<double>(dVar10);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  iVar3 = (**(code **)(*(long *)(&decpomdp->field_0x0 + *(long *)(*(long *)decpomdp + -0xb0)) + 0x80
                      ))(&decpomdp->field_0x0 + *(long *)(*(long *)decpomdp + -0xb0));
  if (iVar3 == 1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"values: cost",0xc);
  }
  else {
    if (iVar3 != 0) goto LAB_003a4bef;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"values: reward",0xe);
  }
  std::ios::widen((char)&local_230 + (char)*(undefined8 *)(local_230 + -0x18));
  std::ostream::put((char)local_228 + -8);
  std::ostream::flush();
LAB_003a4bef:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"states:",7);
  if (0 < iVar2) {
    iVar3 = 0;
    do {
      plVar5 = (long *)(**(code **)(*(long *)(&decpomdp->field_0x0 +
                                             *(long *)(*(long *)decpomdp + -0xb8)) + 0x38))
                                 (&decpomdp->field_0x0 + *(long *)(*(long *)decpomdp + -0xb8),iVar3)
      ;
      (**(code **)(*plVar5 + 0x18))(&local_258);
      plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_258,0,(char *)0x0,0x4eca7b);
      plVar7 = plVar5 + 2;
      if ((long *)*plVar5 == plVar7) {
        local_278 = *plVar7;
        lStack_270 = plVar5[3];
        local_288._M_current = (char *)&local_278;
      }
      else {
        local_278 = *plVar7;
        local_288._M_current = (char *)*plVar5;
      }
      lVar1 = plVar5[1];
      *plVar5 = (long)plVar7;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      if ((long *)CONCAT71(uStack_257,local_258) != local_248) {
        operator_delete((long *)CONCAT71(uStack_257,local_258),local_248[0] + 1);
      }
      local_258 = 0x5f;
      _Var6 = std::
              __remove_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                        (local_288,local_288._M_current + lVar1,
                         (_Iter_equals_val<const_char>)&local_258);
      *_Var6._M_current = '\0';
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230," ",1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_230,local_288._M_current,
                 (long)_Var6._M_current - (long)local_288._M_current);
      if ((long *)local_288._M_current != &local_278) {
        operator_delete(local_288._M_current,local_278 + 1);
      }
      iVar3 = iVar3 + 1;
    } while (iVar2 != iVar3);
  }
  std::ios::widen((char)&local_230 + (char)*(undefined8 *)(local_230 + -0x18));
  std::ostream::put((char)&local_230);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"actions:",8);
  if (0 < (int)local_268) {
    iVar3 = 0;
    do {
      plVar5 = (long *)(**(code **)(*(long *)(&decpomdp->field_0x0 +
                                             *(long *)(*(long *)decpomdp + -0xb8)) + 0x80))
                                 (&decpomdp->field_0x0 + *(long *)(*(long *)decpomdp + -0xb8),iVar3)
      ;
      (**(code **)(*plVar5 + 0x20))(&local_258);
      plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_258,0,(char *)0x0,0x4eb1e6);
      plVar7 = plVar5 + 2;
      if ((long *)*plVar5 == plVar7) {
        local_278 = *plVar7;
        lStack_270 = plVar5[3];
        local_288._M_current = (char *)&local_278;
      }
      else {
        local_278 = *plVar7;
        local_288._M_current = (char *)*plVar5;
      }
      lVar1 = plVar5[1];
      *plVar5 = (long)plVar7;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      if ((long *)CONCAT71(uStack_257,local_258) != local_248) {
        operator_delete((long *)CONCAT71(uStack_257,local_258),local_248[0] + 1);
      }
      local_258 = 0x5f;
      _Var6 = std::
              __remove_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                        (local_288,local_288._M_current + lVar1,
                         (_Iter_equals_val<const_char>)&local_258);
      *_Var6._M_current = '\0';
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230," ",1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_230,local_288._M_current,
                 (long)_Var6._M_current - (long)local_288._M_current);
      if ((long *)local_288._M_current != &local_278) {
        operator_delete(local_288._M_current,local_278 + 1);
      }
      iVar3 = iVar3 + 1;
    } while ((int)local_268 != iVar3);
  }
  std::ios::widen((char)&local_230 + (char)*(undefined8 *)(local_230 + -0x18));
  std::ostream::put((char)&local_230);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"observations:",0xd);
  if (0 < (int)local_238) {
    iVar3 = 0;
    do {
      plVar5 = (long *)(**(code **)(*(long *)(&decpomdp->field_0x0 +
                                             *(long *)(*(long *)decpomdp + -0xb8)) + 0xd8))
                                 (&decpomdp->field_0x0 + *(long *)(*(long *)decpomdp + -0xb8),iVar3)
      ;
      (**(code **)(*plVar5 + 0x20))(&local_258);
      plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_258,0,(char *)0x0,0x4ea3d1);
      plVar7 = plVar5 + 2;
      if ((long *)*plVar5 == plVar7) {
        local_278 = *plVar7;
        lStack_270 = plVar5[3];
        local_288._M_current = (char *)&local_278;
      }
      else {
        local_278 = *plVar7;
        local_288._M_current = (char *)*plVar5;
      }
      lVar1 = plVar5[1];
      *plVar5 = (long)plVar7;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      if ((long *)CONCAT71(uStack_257,local_258) != local_248) {
        operator_delete((long *)CONCAT71(uStack_257,local_258),local_248[0] + 1);
      }
      local_258 = 0x5f;
      _Var6 = std::
              __remove_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                        (local_288,local_288._M_current + lVar1,
                         (_Iter_equals_val<const_char>)&local_258);
      *_Var6._M_current = '\0';
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230," ",1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_230,local_288._M_current,
                 (long)_Var6._M_current - (long)local_288._M_current);
      if ((long *)local_288._M_current != &local_278) {
        operator_delete(local_288._M_current,local_278 + 1);
      }
      iVar3 = iVar3 + 1;
    } while ((int)local_238 != iVar3);
  }
  std::ios::widen((char)&local_230 + (char)*(undefined8 *)(local_230 + -0x18));
  std::ostream::put((char)&local_230);
  std::ostream::flush();
  plVar5 = (long *)(**(code **)(*(long *)(&decpomdp->field_0x0 +
                                         *(long *)(*(long *)decpomdp + -0xb8)) + 0x50))
                             (&decpomdp->field_0x0 + *(long *)(*(long *)decpomdp + -0xb8));
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"start: ",7);
  if (0 < iVar2) {
    iVar3 = 0;
    do {
      dVar10 = (double)(**(code **)(*plVar5 + 0x10))(plVar5,iVar3);
      poVar4 = std::ostream::_M_insert<double>(dVar10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
      iVar3 = iVar3 + 1;
    } while (iVar2 != iVar3);
  }
  std::ios::widen((char)(ostream *)&local_230 + (char)*(undefined8 *)(local_230 + -0x18));
  std::ostream::put((char)&local_230);
  std::ostream::flush();
  if (plVar5 != (long *)0x0) {
    (**(code **)(*plVar5 + 8))(plVar5);
  }
  if (0 < (int)local_268) {
    iVar3 = 0;
    do {
      if (0 < iVar2) {
        iVar8 = 0;
        do {
          iVar9 = 0;
          do {
            local_260 = (double)(**(code **)(*(long *)(&decpomdp->field_0x0 +
                                                      *(long *)(*(long *)decpomdp + -0xb8)) + 0x108)
                                )(&decpomdp->field_0x0 + *(long *)(*(long *)decpomdp + -0xb8),iVar8,
                                  iVar3,iVar9);
            if ((local_260 != 0.0) || (NAN(local_260))) {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"T: ",3);
              poVar4 = (ostream *)std::ostream::operator<<((ostream *)&local_230,iVar3);
              std::__ostream_insert<char,std::char_traits<char>>(poVar4," : ",3);
              poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,iVar8);
              std::__ostream_insert<char,std::char_traits<char>>(poVar4," : ",3);
              poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,iVar9);
              std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
              poVar4 = std::ostream::_M_insert<double>(local_260);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
              std::ostream::put((char)poVar4);
              std::ostream::flush();
            }
            iVar9 = iVar9 + 1;
          } while (iVar2 != iVar9);
          iVar8 = iVar8 + 1;
        } while (iVar8 != iVar2);
      }
      iVar3 = iVar3 + 1;
    } while (iVar3 != (int)local_268);
  }
  if (0 < (int)local_268) {
    iVar3 = 0;
    do {
      if (0 < (int)local_238) {
        iVar8 = 0;
        do {
          if (0 < iVar2) {
            iVar9 = 0;
            do {
              local_260 = (double)(**(code **)(*(long *)(&decpomdp->field_0x0 +
                                                        *(long *)(*(long *)decpomdp + -0xb8)) +
                                              0x118))(&decpomdp->field_0x0 +
                                                      *(long *)(*(long *)decpomdp + -0xb8),iVar3,
                                                      iVar9,iVar8);
              if ((local_260 != 0.0) || (NAN(local_260))) {
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"O: ",3);
                poVar4 = (ostream *)std::ostream::operator<<((ostream *)&local_230,iVar3);
                std::__ostream_insert<char,std::char_traits<char>>(poVar4," : ",3);
                poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,iVar9);
                std::__ostream_insert<char,std::char_traits<char>>(poVar4," : ",3);
                poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,iVar8);
                std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
                poVar4 = std::ostream::_M_insert<double>(local_260);
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
                std::ostream::put((char)poVar4);
                std::ostream::flush();
              }
              iVar9 = iVar9 + 1;
            } while (iVar2 != iVar9);
          }
          iVar8 = iVar8 + 1;
        } while (iVar8 != (int)local_238);
      }
      iVar3 = iVar3 + 1;
    } while (iVar3 != (int)local_268);
  }
  if (0 < (int)local_268) {
    iVar3 = 0;
    do {
      if (0 < iVar2) {
        iVar8 = 0;
        do {
          local_260 = (double)(**(code **)(*(long *)decpomdp + 0xc0))(decpomdp,iVar8,iVar3);
          if ((local_260 != 0.0) || (NAN(local_260))) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"R: ",3);
            poVar4 = (ostream *)std::ostream::operator<<((ostream *)&local_230,iVar3);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4," : ",3);
            poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,iVar8);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4," : * : * ",9);
            poVar4 = std::ostream::_M_insert<double>(local_260);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
            std::ostream::put((char)poVar4);
            std::ostream::flush();
          }
          iVar8 = iVar8 + 1;
        } while (iVar2 != iVar8);
      }
      iVar3 = iVar3 + 1;
    } while (iVar3 != (int)local_268);
  }
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = __M_insert<void_const*>;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void AlphaVectorPlanning::ExportPOMDPFile(const string & filename,
                                          const DecPOMDPDiscreteInterface *decpomdp)
{
    int nrA=decpomdp->GetNrJointActions(),
        nrO=decpomdp->GetNrJointObservations(),
        nrS=decpomdp->GetNrStates();
    ofstream fp(filename.c_str());
    if(!fp)
    {
        cerr << "AlphaVectorPOMDP::ExportPOMDPFile: failed to open file "
             << filename << endl;            
    }

    fp << "discount: " << decpomdp->GetDiscount() << endl;
    switch(decpomdp->GetRewardType())
    {
    case REWARD:
        fp << "values: reward" << endl;
        break;
    case COST:
        fp << "values: cost" << endl;
    }

    // Tony's parser chokes on "_" in names of
    // states/actions/observations, so we just remove them from the
    // strings.
    // Also, we have to ensure that strings don't start with a number,
    // which we solve by prepending each string with s/a/o.
    fp << "states:";
    for(int s=0;s<nrS;s++)
    {
        string state="s" + decpomdp->GetState(s)->SoftPrintBrief();
        state.erase(remove(state.begin(), state.end(), '_'),state.end());
        fp << " "  << state;
    }
    fp << endl;

    fp << "actions:";
    for(int a=0;a<nrA;a++)
    {
        string action="a" + decpomdp->GetJointAction(a)->SoftPrintBrief();
        action.erase(remove(action.begin(), action.end(), '_'),action.end());
        fp << " "  << action;
    }
    fp << endl;

    fp << "observations:";
    for(int o=0;o<nrO;o++)
    {
        string obs="o" + decpomdp->GetJointObservation(o)->SoftPrintBrief();
        obs.erase(remove(obs.begin(), obs.end(), '_'),obs.end());
        fp << " "  << obs;
    }
    fp << endl;


    StateDistribution* isd = decpomdp->GetISD();
    fp << "start: ";
    for(int s0=0;s0<nrS;s0++)
    {
        double bs = isd->GetProbability(s0);
        fp <<  bs << " ";
    }
    fp << endl;

    delete isd;

    double p;
    for(int a=0;a<nrA;a++)
        for(int s0=0;s0<nrS;s0++)
            for(int s1=0;s1<nrS;s1++)
            {
                p=decpomdp->GetTransitionProbability(s0,a,s1);
                if(p!=0)
                    fp << "T: " << a << " : " << s0 << " : " << s1 << " " 
                       << p << endl;
            }

    for(int a=0;a<nrA;a++)
        for(int o=0;o<nrO;o++)
            for(int s1=0;s1<nrS;s1++)
            {
                p=decpomdp->GetObservationProbability(a,s1,o);
                if(p!=0)
                    fp << "O: " << a << " : " << s1 << " : " << o << " " 
                       << p << endl;
            }

    for(int a=0;a<nrA;a++)
        for(int s0=0;s0<nrS;s0++)
        {
            p=decpomdp->GetReward(s0,a);
            if(p!=0)
                fp << "R: " << a << " : " << s0 << " : * : * "
                   << p << endl;
        }

}